

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pubkey_to_pedersen_commitment
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,secp256k1_pubkey *pubkey
              )

{
  long in_RDX;
  void *in_RSI;
  secp256k1_ge P;
  secp256k1_ge *in_stack_ffffffffffffff88;
  secp256k1_callback *in_stack_ffffffffffffff90;
  secp256k1_pubkey *in_stack_ffffffffffffffc8;
  secp256k1_ge *in_stack_ffffffffffffffd0;
  secp256k1_context *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RDX == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
      local_4 = 0;
    }
    else {
      secp256k1_pubkey_load
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      secp256k1_pedersen_commitment_save
                ((secp256k1_pedersen_commitment *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
      secp256k1_ge_clear((secp256k1_ge *)0x10bd75);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_pubkey_to_pedersen_commitment(const secp256k1_context* ctx, secp256k1_pedersen_commitment* commit, const secp256k1_pubkey* pubkey)  {
    secp256k1_ge P;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    memset(commit, 0, sizeof(*commit));
    ARG_CHECK(pubkey != NULL);

    secp256k1_pubkey_load(ctx, &P, pubkey);
    secp256k1_pedersen_commitment_save(commit, &P);

    secp256k1_ge_clear(&P);
    return 1;
}